

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testHasVolume<Imath_2_5::Vec3<double>>(char *type)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  double *pdVar6;
  char *in_RDI;
  Box<Imath_2_5::Vec3<double>_> b_2;
  Vec3<double> max;
  Vec3<double> min;
  Box<Imath_2_5::Vec3<double>_> b1;
  uint i;
  Vec3<double> p1;
  Vec3<double> p0;
  Box<Imath_2_5::Vec3<double>_> b0;
  Box<Imath_2_5::Vec3<double>_> b_1;
  Box<Imath_2_5::Vec3<double>_> b;
  Box<Imath_2_5::Vec3<double>_> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  Box<Imath_2_5::Vec3<double>_> *in_stack_fffffffffffffe70;
  Box<Imath_2_5::Vec3<double>_> *in_stack_fffffffffffffe78;
  Box<Imath_2_5::Vec3<double>_> *in_stack_fffffffffffffe90;
  Vec3<double> local_160;
  Vec3<double> local_148 [3];
  uint local_fc;
  Vec3<double> local_f8;
  Vec3<double> local_e0;
  Vec3<double> local_c8;
  Vec3<double> local_b0 [7];
  char *local_8;
  
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"    hasVolume() for type ");
  poVar5 = std::operator<<(poVar5,local_8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec3<double>_>::Box(in_stack_fffffffffffffe60);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec3<double>_>::hasVolume(in_stack_fffffffffffffe78);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x355,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec3<double>]"
                 );
  }
  Imath_2_5::Box<Imath_2_5::Vec3<double>_>::Box(in_stack_fffffffffffffe60);
  Imath_2_5::Box<Imath_2_5::Vec3<double>_>::makeInfinite(in_stack_fffffffffffffe90);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec3<double>_>::hasVolume(in_stack_fffffffffffffe78);
  if (!bVar2) {
    __assert_fail("b.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x35e,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec3<double>]"
                 );
  }
  Imath_2_5::Vec3<double>::Vec3(local_b0,-1.0);
  Imath_2_5::Vec3<double>::Vec3(&local_c8,1.0);
  Imath_2_5::Box<Imath_2_5::Vec3<double>_>::Box
            (in_stack_fffffffffffffe70,
             (Vec3<double> *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             &in_stack_fffffffffffffe60->min);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec3<double>_>::hasVolume(in_stack_fffffffffffffe78);
  if (!bVar2) {
    __assert_fail("b0.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x369,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec3<double>]"
                 );
  }
  Imath_2_5::Vec3<double>::Vec3(&local_e0);
  Imath_2_5::Vec3<double>::Vec3(&local_f8);
  local_fc = 0;
  while( true ) {
    uVar4 = local_fc;
    uVar3 = Imath_2_5::Vec3<double>::dimensions();
    if (uVar3 <= uVar4) break;
    cVar1 = (char)local_fc;
    pdVar6 = Imath_2_5::Vec3<double>::operator[](&local_e0,local_fc);
    *pdVar6 = -(double)(1 << (cVar1 + 1U & 0x1f));
    uVar4 = Imath_2_5::Vec3<double>::dimensions();
    in_stack_fffffffffffffe60 =
         (Box<Imath_2_5::Vec3<double>_> *)(double)(1 << ((char)uVar4 - (char)local_fc & 0x1fU));
    pdVar6 = Imath_2_5::Vec3<double>::operator[](&local_f8,local_fc);
    *pdVar6 = (double)in_stack_fffffffffffffe60;
    local_fc = local_fc + 1;
  }
  Imath_2_5::Box<Imath_2_5::Vec3<double>_>::Box
            (in_stack_fffffffffffffe70,(Vec3<double> *)CONCAT44(uVar4,in_stack_fffffffffffffe68),
             &in_stack_fffffffffffffe60->min);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec3<double>_>::hasVolume(in_stack_fffffffffffffe78);
  if (!bVar2) {
    __assert_fail("b1.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x373,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec3<double>]"
                 );
  }
  Imath_2_5::Vec3<double>::Vec3(local_148,0.0);
  Imath_2_5::Vec3<double>::Vec3(&local_160,local_148);
  uVar3 = Imath_2_5::Vec3<double>::dimensions();
  pdVar6 = Imath_2_5::Vec3<double>::operator[](&local_160,uVar3 - 1);
  *pdVar6 = 2.0;
  Imath_2_5::Box<Imath_2_5::Vec3<double>_>::Box
            (in_stack_fffffffffffffe70,(Vec3<double> *)CONCAT44(uVar4,in_stack_fffffffffffffe68),
             &in_stack_fffffffffffffe60->min);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec3<double>_>::hasVolume(in_stack_fffffffffffffe78);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,900,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec3<double>]"
                 );
  }
  return;
}

Assistant:

void
testHasVolume(const char *type)
{
    cout << "    hasVolume() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert(!b.hasVolume());
    }

    //
    // Infinite box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.makeInfinite();
        assert(b.hasVolume());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0(T(-1), T(1));
        assert(b0.hasVolume());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
            p0[i] = -typename T::BaseType(1 << (i + 1));
            p1[i] =  typename T::BaseType(1 << (T::dimensions() - i));
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
        assert(b1.hasVolume());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min(0);
        T max = min;
        max[T::dimensions() - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b(min, max);

        assert(!b.hasVolume());
    }
}